

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  bool bVar1;
  int iVar2;
  int local_94;
  double dStack_90;
  int v32;
  double arg1f_2;
  double arg0f_1;
  double *v_2;
  float arg1f_1;
  float arg0f;
  float *v_1;
  float arg1f;
  int arg0i;
  int *v;
  ImGuiDataTypeInfo *pIStack_50;
  int arg1i;
  ImGuiDataTypeInfo *type_info;
  int data_backup [2];
  char op;
  char *format_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *initial_value_buf_local;
  char *buf_local;
  
  unique0x10000440 = format;
  initial_value_buf_local = buf;
  while (bVar1 = ImCharIsBlankA(*initial_value_buf_local), bVar1) {
    initial_value_buf_local = initial_value_buf_local + 1;
  }
  data_backup[0]._3_1_ = *initial_value_buf_local;
  if (((data_backup[0]._3_1_ == '+') || (data_backup[0]._3_1_ == '*')) ||
     (data_backup[0]._3_1_ == '/')) {
    do {
      initial_value_buf_local = initial_value_buf_local + 1;
      bVar1 = ImCharIsBlankA(*initial_value_buf_local);
    } while (bVar1);
  }
  else {
    data_backup[0]._3_1_ = '\0';
  }
  if (*initial_value_buf_local == '\0') {
    return false;
  }
  if (9 < data_type) {
    __assert_fail("data_type < ImGuiDataType_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x6f2,
                  "bool ImGui::DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                 );
  }
  pIStack_50 = DataTypeGetInfo(data_type);
  if (pIStack_50->Size < 9) {
    memcpy((void *)((long)&type_info + 4),data_ptr,pIStack_50->Size);
    if (stack0xffffffffffffffc8 == (char *)0x0) {
      unique0x00012000 = pIStack_50->ScanFmt;
    }
    v._4_4_ = 0;
    if (data_type == 4) {
      v_1._4_4_ = *data_ptr;
      v_1._0_4_ = 0.0;
      _arg1f = (int *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,stack0xffffffffffffffc8,(long)&v_1 + 4),
         iVar2 < 1)) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%d",(long)&v + 4);
        if (iVar2 != 0) {
          *_arg1f = v_1._4_4_ + v._4_4_;
        }
      }
      else if (data_backup[0]._3_1_ == '*') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",&v_1);
        if (iVar2 != 0) {
          *_arg1f = (int)((float)v_1._4_4_ * v_1._0_4_);
        }
      }
      else if (data_backup[0]._3_1_ == '/') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",&v_1);
        if ((iVar2 != 0) && ((v_1._0_4_ != 0.0 || (NAN(v_1._0_4_))))) {
          *_arg1f = (int)((float)v_1._4_4_ / v_1._0_4_);
        }
      }
      else {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,(long)&v + 4);
        if (iVar2 == 1) {
          *_arg1f = v._4_4_;
        }
      }
    }
    else if (data_type == 8) {
      stack0xffffffffffffffc8 = "%f";
      v_2._4_4_ = *data_ptr;
      v_2._0_4_ = 0.0;
      _arg1f_1 = (float *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,"%f",(long)&v_2 + 4), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,&v_2);
      if (iVar2 < 1) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        *_arg1f_1 = v_2._4_4_ + v_2._0_4_;
      }
      else if (data_backup[0]._3_1_ == '*') {
        *_arg1f_1 = v_2._4_4_ * v_2._0_4_;
      }
      else if (data_backup[0]._3_1_ == '/') {
        if ((v_2._0_4_ != 0.0) || (NAN(v_2._0_4_))) {
          *_arg1f_1 = v_2._4_4_ / v_2._0_4_;
        }
      }
      else {
        *_arg1f_1 = v_2._0_4_;
      }
    }
    else if (data_type == 9) {
      stack0xffffffffffffffc8 = "%lf";
      arg1f_2 = *data_ptr;
      dStack_90 = 0.0;
      arg0f_1 = (double)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,"%lf",&arg1f_2), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,
                              &stack0xffffffffffffff70);
      if (iVar2 < 1) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        *(double *)arg0f_1 = arg1f_2 + dStack_90;
      }
      else if (data_backup[0]._3_1_ == '*') {
        *(double *)arg0f_1 = arg1f_2 * dStack_90;
      }
      else if (data_backup[0]._3_1_ == '/') {
        if ((dStack_90 != 0.0) || (NAN(dStack_90))) {
          *(double *)arg0f_1 = arg1f_2 / dStack_90;
        }
      }
      else {
        *(double *)arg0f_1 = dStack_90;
      }
    }
    else if (((data_type == 5) || (data_type == 6)) || (data_type == 7)) {
      __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,data_ptr);
    }
    else {
      __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,&local_94);
      if (data_type == 0) {
        iVar2 = ImClamp<int>(local_94,-0x80,0x7f);
        *(char *)data_ptr = (char)iVar2;
      }
      else if (data_type == 1) {
        iVar2 = ImClamp<int>(local_94,0,0xff);
        *(char *)data_ptr = (char)iVar2;
      }
      else if (data_type == 2) {
        iVar2 = ImClamp<int>(local_94,-0x8000,0x7fff);
        *(short *)data_ptr = (short)iVar2;
      }
      else {
        if (data_type != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                        ,0x73b,
                        "bool ImGui::DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                       );
        }
        iVar2 = ImClamp<int>(local_94,0,0xffff);
        *(short *)data_ptr = (short)iVar2;
      }
    }
    iVar2 = memcmp((void *)((long)&type_info + 4),data_ptr,pIStack_50->Size);
    return iVar2 != 0;
  }
  __assert_fail("type_info->Size <= sizeof(data_backup)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                ,0x6f5,
                "bool ImGui::DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
               );
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    const ImGuiDataTypeInfo* type_info = ImGui::DataTypeGetInfo(data_type);
    IM_ASSERT(type_info->Size <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)data_ptr;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        sscanf(buf, format, data_ptr);
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        sscanf(buf, format, &v32);
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)data_ptr = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)data_ptr = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)data_ptr = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)data_ptr = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(data_backup, data_ptr, type_info->Size) != 0;
}